

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiViewportP::~ImGuiViewportP(ImGuiViewportP *this)

{
  if (this->DrawLists[0] != (ImDrawList *)0x0) {
    IM_DELETE<ImDrawList>(this->DrawLists[0]);
  }
  if (this->DrawLists[1] != (ImDrawList *)0x0) {
    IM_DELETE<ImDrawList>(this->DrawLists[1]);
  }
  ImDrawDataBuilder::~ImDrawDataBuilder(&this->DrawDataBuilder);
  return;
}

Assistant:

~ImGuiViewportP()   { if (DrawLists[0]) IM_DELETE(DrawLists[0]); if (DrawLists[1]) IM_DELETE(DrawLists[1]); }